

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

void PredictorAdd1_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  
  cVar25 = (char)out[2];
  cVar26 = *(char *)((long)out + 9);
  cVar27 = *(char *)((long)out + 10);
  cVar28 = *(char *)((long)out + 0xb);
  lVar3 = 0;
  lVar4 = 0;
  while (lVar4 + 4 <= (long)num_pixels) {
    auVar2 = *(undefined1 (*) [16])(in + lVar4);
    cVar5 = auVar2[0];
    cVar6 = auVar2[1];
    cVar7 = auVar2[2];
    cVar8 = auVar2[3];
    cVar13 = cVar5 + auVar2[4];
    cVar15 = cVar6 + auVar2[5];
    cVar17 = cVar7 + auVar2[6];
    cVar19 = cVar8 + auVar2[7];
    cVar9 = cVar5 + cVar25;
    cVar10 = cVar6 + cVar26;
    cVar11 = cVar7 + cVar27;
    cVar12 = cVar8 + cVar28;
    cVar14 = cVar13 + cVar25;
    cVar16 = cVar15 + cVar26;
    cVar18 = cVar17 + cVar27;
    cVar20 = cVar19 + cVar28;
    cVar21 = auVar2[4] + auVar2[8] + cVar25;
    cVar22 = auVar2[5] + auVar2[9] + cVar26;
    cVar23 = auVar2[6] + auVar2[10] + cVar27;
    cVar24 = auVar2[7] + auVar2[0xb] + cVar28;
    cVar25 = auVar2[8] + auVar2[0xc] + cVar25 + cVar13;
    cVar26 = auVar2[9] + auVar2[0xd] + cVar26 + cVar15;
    cVar27 = auVar2[10] + auVar2[0xe] + cVar27 + cVar17;
    cVar28 = auVar2[0xb] + auVar2[0xf] + cVar28 + cVar19;
    puVar1 = out + lVar4;
    *(char *)puVar1 = cVar9;
    *(char *)((long)puVar1 + 1) = cVar10;
    *(char *)((long)puVar1 + 2) = cVar11;
    *(char *)((long)puVar1 + 3) = cVar12;
    *(char *)(puVar1 + 1) = cVar14;
    *(char *)((long)puVar1 + 5) = cVar16;
    *(char *)((long)puVar1 + 6) = cVar18;
    *(char *)((long)puVar1 + 7) = cVar20;
    *(char *)(puVar1 + 2) = cVar21 + cVar5;
    *(char *)((long)puVar1 + 9) = cVar22 + cVar6;
    *(char *)((long)puVar1 + 10) = cVar23 + cVar7;
    *(char *)((long)puVar1 + 0xb) = cVar24 + cVar8;
    *(char *)(puVar1 + 3) = cVar25;
    *(char *)((long)puVar1 + 0xd) = cVar26;
    *(char *)((long)puVar1 + 0xe) = cVar27;
    *(char *)((long)puVar1 + 0xf) = cVar28;
    lVar3 = lVar3 + -0x10;
    lVar4 = lVar4 + 4;
  }
  if (num_pixels == (int)lVar4) {
    return;
  }
  (*VP8LPredictorsAdd_C[1])
            ((uint32_t *)((long)in - lVar3),(uint32_t *)((long)upper - lVar3),
             num_pixels - (int)lVar4,(uint32_t *)((long)out - lVar3));
  return;
}

Assistant:

static void PredictorAdd1_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  __m128i prev = _mm_set1_epi32((int)out[-1]);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    // a | b | c | d
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    // 0 | a | b | c
    const __m128i shift0 = _mm_slli_si128(src, 4);
    // a | a + b | b + c | c + d
    const __m128i sum0 = _mm_add_epi8(src, shift0);
    // 0 | 0 | a | a + b
    const __m128i shift1 = _mm_slli_si128(sum0, 8);
    // a | a + b | a + b + c | a + b + c + d
    const __m128i sum1 = _mm_add_epi8(sum0, shift1);
    const __m128i res = _mm_add_epi8(sum1, prev);
    _mm_storeu_si128((__m128i*)&out[i], res);
    // replicate prev output on the four lanes
    prev = _mm_shuffle_epi32(res, (3 << 0) | (3 << 2) | (3 << 4) | (3 << 6));
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[1](in + i, upper + i, num_pixels - i, out + i);
  }
}